

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void pstore::create_log_stream(string *ident)

{
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  *this;
  bool bVar1;
  pointer pvVar2;
  size_t __n;
  syslog_logger *this_00;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this_01;
  vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
  *pvVar3;
  stderr_logger *this_02;
  long *in_FS_OFFSET;
  stderr_logger *local_80;
  undefined1 local_73;
  file_system_traits local_72;
  fstream_traits local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *local_50;
  undefined4 local_44;
  undefined8 uStack_40;
  uint num_backups;
  streamoff max_size;
  unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  local_20;
  __single_object loggers;
  bitset<4UL> enabled;
  string *ident_local;
  
  std::bitset<4UL>::bitset((bitset<4UL> *)&loggers);
  std::bitset<4UL>::set((bitset<4UL> *)&loggers,3,true);
  std::
  make_unique<std::vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>>
            ();
  pvVar2 = std::
           unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
           ::operator->(&local_20);
  __n = std::bitset<4UL>::count((bitset<4UL> *)&loggers);
  std::
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  ::reserve(pvVar2,__n);
  bVar1 = std::bitset<4UL>::test((bitset<4UL> *)&loggers,3);
  if (bVar1) {
    pvVar3 = (vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
              *)std::
                unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                ::operator->(&local_20);
    this_00 = (syslog_logger *)operator_new(0x68);
    anon_unknown.dwarf_1167cd::syslog_logger::syslog_logger(this_00,ident,8);
    max_size = (streamoff)this_00;
    std::
    vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
    ::emplace_back<(anonymous_namespace)::syslog_logger*>(pvVar3,(syslog_logger **)&max_size);
  }
  bVar1 = std::bitset<4UL>::test((bitset<4UL> *)&loggers,1);
  if (bVar1) {
    uStack_40 = 0x100000;
    local_44 = 10;
    pvVar3 = (vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
              *)std::
                unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                ::operator->(&local_20);
    this_01 = (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *)
              operator_new(0x288);
    local_73 = 1;
    std::operator+(local_70,(char *)ident);
    basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::basic_rotating_log
              (this_01,local_70,0x100000,10,&local_71,&local_72);
    local_73 = 0;
    local_50 = this_01;
    std::
    vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
    ::emplace_back<pstore::basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>*>
              (pvVar3,&local_50);
    std::__cxx11::string::~string((string *)local_70);
  }
  bVar1 = std::bitset<4UL>::test((bitset<4UL> *)&loggers,2);
  if (bVar1) {
    pvVar3 = (vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
              *)std::
                unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                ::operator->(&local_20);
    this_02 = (stderr_logger *)operator_new(0x58);
    stderr_logger::stderr_logger(this_02);
    local_80 = this_02;
    std::
    vector<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>,std::allocator<std::unique_ptr<pstore::logger,std::default_delete<pstore::logger>>>>
    ::emplace_back<pstore::stderr_logger*>(pvVar3,&local_80);
  }
  this = *(vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
           **)(*in_FS_OFFSET + -8);
  if (this != (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
               *)0x0) {
    std::
    vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    ::~vector(this);
    operator_delete(this,0x18);
  }
  pvVar2 = std::
           unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
           ::release(&local_20);
  *(pointer *)(*in_FS_OFFSET + -8) = pvVar2;
  std::
  unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void create_log_stream (std::string const & ident) {
            std::bitset<handlers::last> enabled;

#ifdef PSTORE_HAVE_OSLOG_H
            enabled.set (handlers::asl);
#elif defined(PSTORE_HAVE_SYS_LOG_H)
            enabled.set (handlers::syslog);
#else
            // TODO: At the moment, I just log to stderr unless syslog() or ASL are available.
            // Consider offering an option to the user to control the logging destination and
            // whether to use file-base logging.
            enabled.set (handlers::standard_error);
#endif

            auto loggers = std::make_unique<details::logger_collection> ();
            loggers->reserve (enabled.count ());

#ifdef PSTORE_HAVE_OSLOG_H
            if (enabled.test (handlers::asl)) {
                loggers->emplace_back (new asl_logger (ident));
            }
#endif
#ifdef PSTORE_HAVE_SYS_LOG_H
            if (enabled.test (handlers::syslog)) {
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                loggers->emplace_back (new syslog_logger (ident, LOG_USER));
            }
#endif

            if (enabled.test (handlers::rotating_file)) {
                constexpr auto max_size = std::streamoff{1024 * 1024};
                constexpr auto num_backups = 10U;
                loggers->emplace_back (new rotating_log (ident + ".log", max_size, num_backups));
            }

            if (enabled.test (handlers::standard_error)) {
                loggers->emplace_back (new stderr_logger);
            }

            using details::log_destinations;
            delete log_destinations;
            log_destinations = loggers.release ();
        }